

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

Raster * rw::ps2::rasterCreate(Raster *raster)

{
  int *piVar1;
  byte *pbVar2;
  uint8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int32 iVar7;
  int iVar8;
  uint uVar9;
  uint8 *puVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint8 *puVar15;
  Raster *pRVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  undefined1 *puVar20;
  undefined8 *puVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  int iVar42;
  ulong uVar43;
  byte bVar44;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  uint uVar48;
  uint uVar49;
  uint64 bufferBase [7];
  uint32 bufferPage_B [8];
  uint64 bufferWidth [7];
  uint32 bufferHeight_P [8];
  uint32 heightstack_Px [8];
  uint32 widthstack_Px [8];
  ulong local_260;
  int local_244;
  ulong local_218;
  int local_210;
  ulong local_200;
  long local_1e8;
  ulong local_1d0;
  ulong local_1c8 [7];
  ulong local_190;
  undefined8 local_188;
  ulong local_180;
  ulong local_178;
  int local_170;
  uint local_16c;
  int local_168 [6];
  ulong auStack_150 [9];
  undefined8 local_108;
  undefined8 local_100;
  int local_f8 [8];
  uint auStack_d8 [8];
  ulong local_b8;
  uint8 **local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_98 [8];
  uint auStack_78 [8];
  uint auStack_58 [10];
  
  iVar7 = getRasterFormat(raster);
  if (iVar7 == 0) {
    return (Raster *)0x0;
  }
  raster->pixels = (uint8 *)0x0;
  raster->palette = (uint8 *)0x0;
  uVar30 = raster->width;
  uVar39 = raster->height;
  uVar47 = (ulong)uVar39;
  raster->originalWidth = uVar30;
  raster->originalHeight = uVar39;
  raster->originalPixels = (uint8 *)0x0;
  iVar42 = nativeRasterOffset;
  if (uVar39 == 0 || uVar30 == 0) {
    raster->flags = 0x80;
    raster->stride = 0;
    raster->originalStride = 0;
    return raster;
  }
  pRVar16 = (Raster *)0x0;
  switch(raster->type) {
  case 0:
  case 4:
    lVar26 = (long)nativeRasterOffset;
    uVar17 = raster->format;
    iVar8 = raster->depth;
    lVar46 = (long)iVar8;
    *(undefined1 *)((long)&raster->pixels + lVar26 + 4) = 0;
    *(undefined8 *)((long)&raster->palette + lVar26) = 0;
    *(undefined4 *)((long)&raster->originalPixels + lVar26) = 0;
    if ((raster->flags & 0x80) != 0) {
      return raster;
    }
    if ((int)uVar30 < 2) {
      uVar41 = 0;
    }
    else {
      iVar11 = 1;
      uVar41 = 0;
      do {
        iVar11 = iVar11 * 2;
        uVar41 = uVar41 + 0x4000000;
      } while (iVar11 < (int)uVar30);
    }
    uVar31 = *(uint *)(&DAT_0013935c + lVar46 * 4);
    if ((int)uVar39 < 2) {
      uVar43 = 0;
    }
    else {
      iVar11 = 1;
      uVar43 = 0;
      do {
        iVar11 = iVar11 * 2;
        uVar43 = uVar43 + 0x40000000;
      } while (iVar11 < (int)uVar39);
    }
    uVar23 = uVar17 & 0xf00;
    iVar11 = *(int *)(rasterCreateTexture(rw::Raster*)::pageWidths + lVar46 * 4 + 0x7c);
    uVar34 = uVar31;
    if ((int)uVar31 < (int)uVar30) {
      uVar34 = uVar30;
    }
    uVar49 = uVar34 + 0x3f;
    if (-1 < (int)uVar34) {
      uVar49 = uVar34;
    }
    *(undefined2 *)((long)&raster->privateFlags + lVar26) = (undefined2)defaultMipMapKL;
    uVar34 = uVar17 >> 0xd & 3;
    iVar12 = 0;
    pRVar16 = (Raster *)0x0;
    switch(uVar34) {
    case 0:
      local_188 = CONCAT71((int7)((ulong)((long)&switchD_00128e73::switchdataD_001392cc +
                                         (long)(int)(&switchD_00128e73::switchdataD_001392cc)
                                                    [uVar34]) >> 8),1);
      if (uVar23 == 0x100) {
        uVar22 = 10;
        iVar12 = 0;
        iVar18 = 0;
        local_244 = 0;
        iVar14 = 0;
        local_210 = 0;
        local_1d0 = 0;
        goto LAB_0012900c;
      }
      if (uVar23 == 0x500) {
        iVar18 = 0;
        local_244 = 0;
        iVar14 = 0;
        local_210 = 0;
        local_1d0 = 0;
        local_1e8 = 0;
        local_218 = 0x400000000;
        uVar22 = 0;
      }
      else {
        if (uVar23 != 0x600) {
          return (Raster *)0x0;
        }
        uVar22 = 1;
        iVar12 = 0;
        iVar18 = 0;
        local_244 = 0;
        iVar14 = 0;
        local_210 = 0;
        local_1d0 = 0;
        local_1e8 = 0;
        local_218 = 0;
      }
      goto LAB_0012901d;
    case 1:
      uVar22 = 0x13;
      iVar14 = 0x10;
      local_210 = 0x10;
      break;
    case 2:
      uVar22 = 0x14;
      local_210 = 8;
      iVar14 = 2;
      break;
    case 3:
      goto switchD_00128d7c_caseD_3;
    }
    iVar18 = 0x40;
    if (uVar23 == 0x100) {
      local_1d0 = 0x2000000000000000;
      local_188 = 0;
      local_1e8 = 10;
      local_244 = 2;
      iVar12 = 0x40;
    }
    else {
      if (uVar23 != 0x500) {
        return (Raster *)0x0;
      }
      local_1d0 = 0x2000000000000000;
      local_188 = 0x2000000000000001;
      local_244 = 4;
      iVar12 = 0x20;
LAB_0012900c:
      local_1e8 = 0;
    }
    local_218 = 0x400000000;
LAB_0012901d:
    local_b0 = &raster->pixels;
    local_100 = (long)((int)uVar49 >> 6);
    local_1c8[4] = 0;
    local_1c8[5] = 0;
    local_1c8[2] = 0;
    local_1c8[3] = 0;
    local_1c8[1] = 0;
    local_1c8[6] = 0;
    lVar19 = 0;
    do {
      auStack_150[lVar19 + 1] = 1;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 7);
    iVar24 = iVar8 * uVar30;
    iVar25 = iVar24 + 7;
    if (-1 < iVar24) {
      iVar25 = iVar24;
    }
    raster->stride = iVar25 >> 3;
    uVar34 = (uint)uVar22;
    if ((short)uVar17 < 0) {
      *(undefined4 *)((long)&raster->stride + lVar26) = 0;
      if (maxMipLevels < 1) {
        local_108 = CONCAT71((int7)(int3)((uint)iVar42 >> 8),0xfc);
      }
      else {
        lVar19 = 0;
        uVar45 = 0;
        uVar32 = (long)((int)uVar49 >> 6);
        uVar37 = uVar47;
        uVar23 = 0;
        uVar17 = uVar30;
        while ((iVar42 = (int)uVar37, (int)uVar39 < 8 || (int)uVar30 < 8 ||
               ((7 < (int)uVar17 && (7 < iVar42))))) {
          iVar18 = iVar42 * iVar8 * uVar17;
          iVar12 = iVar18 + 7;
          if (-1 < iVar18) {
            iVar12 = iVar18;
          }
          piVar1 = (int *)((long)&raster->stride + lVar26);
          *piVar1 = *piVar1 + ((iVar12 >> 3) + 0x3fU & 0xffffffc0);
          uVar49 = uVar17;
          if ((int)uVar17 < (int)uVar31) {
            uVar49 = uVar31;
          }
          uVar9 = uVar49 + 0x3f;
          if (-1 < (int)uVar49) {
            uVar9 = uVar49;
          }
          uVar36 = (ulong)((int)uVar9 >> 6);
          auStack_150[lVar19 + 1] = uVar36;
          uVar49 = uVar45;
          if (uVar32 != uVar36) {
            bVar44 = (char)lVar19 - 1;
            uVar49 = ((((int)uVar39 >> (bVar44 & 0x1f)) + iVar11 + -1) / iVar11) *
                     ((int)(((int)uVar30 >> (bVar44 & 0x1f)) + (uVar31 - 1)) / (int)uVar31) * 0x800
                     + uVar23 & 0xfffff800;
          }
          uVar23 = uVar49 + 0x3f >> 8 & 7;
          if (uVar22 < 0x15) {
            puVar20 = rasterCreateTexture(rw::Raster*)::blockOffset32_24_8;
            if ((0x80003UL >> uVar22 & 1) == 0) {
              if ((0x100004UL >> uVar22 & 1) == 0) {
                if (uVar22 != 10) goto LAB_001292ea;
                puVar20 = rasterCreateTexture(rw::Raster*)::blockOffset16S;
              }
              else {
                puVar20 = rasterCreateTexture(rw::Raster*)::blockOffset16_4;
              }
            }
            uVar23 = *(uint *)(puVar20 + (ulong)uVar23 * 4);
          }
LAB_001292ea:
          local_1c8[lVar19] = (ulong)(((int)(uVar49 + 0x3f) >> 6 & 0xffffffe0U) + uVar23);
          lVar19 = lVar19 + 1;
          if ((0xfffffffc < uVar17 - 2) || (0xfffffffc < iVar42 - 2U)) break;
          uVar45 = ((int)(lVar46 * 0x40 * uVar36 >> 3) * iVar42 >> 2) + uVar49 + 0x3f & 0xffffffc0;
          uVar17 = (int)uVar17 / 2;
          uVar37 = (ulong)(uint)((int)(uVar37 >> 0x1f) + iVar42 >> 1);
          uVar32 = uVar36;
          uVar23 = uVar49;
          if (maxMipLevels <= lVar19) break;
        }
        local_108 = CONCAT71((int7)((ulong)lVar19 >> 8),(char)lVar19 * '\x04' + -4);
      }
      uVar32 = 8;
      if (uVar34 < 0x32) {
        if ((0x3101008000003U >> uVar22 & 1) == 0) {
          if (uVar22 == 0x13) {
            local_260 = 0x80;
            uVar36 = 0x40;
            uVar32 = 0x10;
            uVar37 = 0x10;
          }
          else {
            if (uVar22 != 0x14) goto LAB_00129419;
            uVar36 = 0x80;
            uVar37 = 0x20;
            uVar32 = 0x10;
            local_260 = 0x80;
          }
        }
        else {
          local_260 = 0x40;
          uVar36 = 0x20;
          uVar37 = 8;
        }
      }
      else {
LAB_00129419:
        uVar36 = 0x40;
        uVar37 = 0x10;
        local_260 = 0x40;
      }
      uVar33 = uVar47;
      if ((int)uVar30 < (int)uVar39) {
        uVar33 = (ulong)uVar30;
      }
      uVar17 = 1;
      if (1 < maxMipLevels && 8 < (uint)uVar33) {
        do {
          uVar17 = uVar17 + 1;
          if ((uint)uVar33 < 0x12) break;
          uVar33 = (ulong)((uint)uVar33 >> 1);
        } while ((int)uVar17 < maxMipLevels);
      }
      local_1c8[0] = 0;
      uVar31 = (uint)local_260;
      local_16c = -uVar31;
      local_200 = (ulong)(((uVar30 + uVar31) - 1 & -uVar31) >> 6);
      auStack_150[1] = local_200;
      uVar23 = (uint)uVar36;
      local_190 = 0;
      local_f8[0] = (int)(((uVar39 + uVar23) - 1) / uVar36);
      local_168[0] = 0;
      uVar49 = (uint)uVar37;
      uVar45 = (uint)uVar32;
      if (1 < uVar17) {
        local_a0 = (ulong)(uVar31 - 1);
        local_a8 = (ulong)(uVar23 - 1);
        iVar42 = uVar49 - 1;
        iVar8 = uVar45 - 1;
        local_b8 = local_260;
        local_178 = (ulong)uVar17 - 1;
        lVar46 = 0;
        uVar40 = 0;
        uVar9 = 0;
        uVar33 = 0;
        uVar48 = uVar30;
        do {
          uVar30 = uVar48 >> 1;
          uVar28 = (uint)uVar47;
          uVar39 = (uint)(uVar47 >> 1);
          uVar27 = uVar33;
          if (uVar48 < uVar31) {
            uVar29 = uVar49;
            if (uVar49 < uVar48) {
              uVar29 = uVar48;
            }
            uVar13 = uVar9 + uVar29;
            iVar11 = (int)uVar33;
            if (uVar28 < uVar23) {
              iVar12 = local_f8[lVar46];
              local_f8[lVar46 + 1] = iVar12;
              local_168[lVar46 + 1] = local_168[lVar46];
              auStack_150[lVar46 + 2] = auStack_150[lVar46 + 1];
              if ((ulong)uVar13 < auStack_150[lVar46 + 1] << 6) {
                auStack_58[uVar33] = uVar29;
                uVar9 = uVar45;
                if (uVar45 < uVar28) {
                  uVar9 = uVar28;
                }
                auStack_78[uVar33] = uVar9;
                local_180 = local_1c8[lVar46];
                local_170 = (int)(local_260 / uVar37);
                auStack_d8[uVar33] = (int)((uVar28 + iVar8) / uVar32) * local_170 + (int)local_180;
                uVar27 = (ulong)(iVar11 + 1);
                local_1c8[lVar46 + 1] = (uVar48 + iVar42) / uVar37 + local_180;
                uVar9 = uVar13;
              }
              else {
                uVar48 = uVar45;
                if (uVar45 < uVar28) {
                  uVar48 = uVar28;
                }
                if ((uVar48 + uVar40 < iVar12 * uVar23) && ((int)local_190 == 0)) {
                  local_1c8[lVar46 + 1] =
                       (ulong)(((iVar8 + uVar28) / uVar45) * (int)(local_260 / uVar37)) +
                       local_1c8[lVar46];
                  local_190 = (ulong)((int)lVar46 + 1);
                  uVar40 = uVar40 + uVar28;
                }
                else {
                  uVar27 = (ulong)(iVar11 - 1);
                  uVar48 = uVar49;
                  if (uVar49 < uVar30) {
                    uVar48 = uVar30;
                  }
                  uVar28 = auStack_d8[uVar27];
                  local_1c8[lVar46 + 1] = (ulong)uVar28;
                  uVar29 = auStack_58[uVar27] - uVar48;
                  if (auStack_58[uVar27] < uVar48 || uVar29 == 0) {
                    uVar48 = uVar45;
                    if (uVar45 < uVar39) {
                      uVar48 = uVar39;
                    }
                    uVar29 = auStack_78[uVar27] - uVar48;
                    if (uVar48 <= auStack_78[uVar27] && uVar29 != 0) {
                      auStack_d8[uVar27] =
                           (int)((iVar8 + uVar39) / uVar32) * (int)(local_260 / uVar37) + uVar28;
                      auStack_78[uVar27] = uVar29;
                      uVar27 = uVar33;
                    }
                  }
                  else {
                    auStack_d8[uVar27] = (int)((iVar42 + uVar30) / uVar37) + uVar28;
                    auStack_58[uVar27] = uVar29;
                    uVar27 = uVar33;
                  }
                }
              }
            }
            else {
              local_168[lVar46 + 1] = local_168[lVar46];
              local_f8[lVar46 + 1] = local_f8[lVar46];
              auStack_150[lVar46 + 2] = auStack_150[lVar46 + 1];
              if (uVar13 < uVar31) {
                auStack_78[uVar33] = uVar28;
                auStack_58[uVar33] = uVar29;
                local_180 = local_1c8[lVar46];
                auStack_d8[uVar33] =
                     (int)(local_260 / uVar37) * ((uVar28 + iVar8) / uVar45) + (int)local_180;
                local_1c8[lVar46 + 1] = (uVar48 + iVar42) / uVar37 + local_180;
                uVar27 = (ulong)(iVar11 + 1);
                uVar9 = uVar13;
              }
              else if (iVar11 == 0) {
                local_1c8[lVar46 + 1] =
                     (ulong)(((uVar28 + iVar8) / uVar45) * (int)(local_260 / uVar37)) +
                     local_1c8[lVar46];
                uVar27 = 0;
                uVar40 = uVar40 + uVar28;
              }
              else {
                uVar27 = (ulong)(iVar11 - 1);
                uVar48 = uVar49;
                if (uVar49 < uVar30) {
                  uVar48 = uVar30;
                }
                uVar28 = auStack_d8[uVar27];
                local_1c8[lVar46 + 1] = (ulong)uVar28;
                uVar29 = auStack_58[uVar27] - uVar48;
                if (auStack_58[uVar27] < uVar48 || uVar29 == 0) {
                  uVar48 = uVar45;
                  if (uVar45 < uVar39) {
                    uVar48 = uVar39;
                  }
                  local_190 = 1;
                  uVar29 = auStack_78[uVar27] - uVar48;
                  if (uVar48 <= auStack_78[uVar27] && uVar29 != 0) {
                    auStack_d8[uVar27] =
                         (int)(local_260 / uVar37) * (int)((iVar8 + uVar39) / uVar32) + uVar28;
                    auStack_78[uVar27] = uVar29;
                    uVar27 = uVar33;
                  }
                }
                else {
                  auStack_d8[uVar27] = (int)((iVar42 + uVar30) / uVar37) + uVar28;
                  auStack_58[uVar27] = uVar29;
                  local_190 = 1;
                  uVar27 = uVar33;
                }
              }
            }
          }
          else if (uVar28 < uVar23) {
            local_168[lVar46 + 1] = local_168[lVar46];
            local_f8[lVar46 + 1] = local_f8[lVar46];
            uVar29 = uVar45;
            if (uVar45 < uVar28) {
              uVar29 = uVar28;
            }
            auStack_150[lVar46 + 2] = auStack_150[lVar46 + 1];
            if (uVar29 + uVar40 < uVar23) {
              local_1c8[lVar46 + 1] =
                   ((ulong)(uint)((int)((uVar28 + iVar8) / uVar32) * (int)(local_260 / uVar37)) *
                    auStack_150[lVar46 + 1] * 0x40) / local_b8 + local_1c8[lVar46];
              uVar40 = uVar29 + uVar40;
            }
            else {
              local_1c8[lVar46 + 1] = (uVar48 + iVar42) / uVar37 + local_1c8[lVar46];
              uVar9 = uVar9 + uVar48;
            }
          }
          else {
            uVar33 = (ulong)((int)(uVar47 / uVar32) * (uVar48 / uVar49)) + local_1c8[lVar46];
            local_1c8[lVar46 + 1] = uVar33;
            local_168[lVar46 + 1] = (int)uVar33;
            auStack_150[lVar46 + 2] = (ulong)(((int)local_a0 + uVar30 & local_16c) >> 6);
            local_f8[lVar46 + 1] = (int)(((int)local_a8 + uVar39) / uVar36);
            uVar40 = 0;
            uVar9 = 0;
          }
          lVar46 = lVar46 + 1;
          uVar33 = uVar27;
          uVar47 = uVar47 >> 1;
          uVar48 = uVar30;
        } while (local_178 != lVar46);
      }
      lVar19 = (long)(int)uVar17;
      lVar46 = lVar19 + -1;
      uVar47 = auStack_150[lVar19] << 6;
      uVar31 = *(uint *)((long)&local_100 + lVar19 * 4 + 4);
      uVar23 = uVar31 * uVar23;
      local_178 = (ulong)uVar31;
      if (uVar47 == uVar30 && uVar23 == uVar39) {
        if (uVar34 - 0x13 < 2) {
          uVar30 = (int)(uVar47 / uVar37) * (int)(uVar23 / uVar32) + local_168[lVar46];
        }
        else {
LAB_00129b76:
          uVar30 = 0;
        }
      }
      else if (uVar34 == 0x14) {
        uVar30 = ((int)(uVar47 / local_260) * uVar31 * 0x20 + local_168[lVar46]) - 1;
      }
      else {
        if (uVar34 != 0x13) goto LAB_00129b76;
        uVar30 = (((int)(uVar47 / local_260) * uVar31 * 0x20 + local_168[lVar46]) -
                 (int)(local_260 / uVar37) * (int)(uVar23 / local_260)) - 2;
      }
      uVar33 = 0;
      iVar42 = 0;
      do {
        uVar27 = local_1c8[uVar33];
        uVar31 = (uint)uVar27;
        uVar39 = (uVar31 - iVar42) * uVar49;
        uVar23 = (int)local_200 << 6;
        if ((auStack_150[uVar33 + 1] == local_200) &&
           (uVar9 = (uVar39 / uVar23) * uVar45, uVar9 < 0x800)) {
          uVar39 = uVar39 % uVar23 | uVar9 * 0x10000;
        }
        else {
          iVar42 = local_168[uVar33];
          uVar39 = 0;
          local_200 = auStack_150[uVar33 + 1] & 0xffffffff;
        }
        local_98[uVar33] = uVar39;
        iVar8 = (int)local_200;
        uVar23 = iVar8 << 6;
        uVar39 = (uint)(uVar23 / local_260);
        if (1 < uVar39) {
          uVar4 = (uint)(iVar8 << 0xb) / local_260;
          uVar5 = uVar23 / uVar37;
          uVar6 = local_260 / uVar37;
          uVar9 = (uint)uVar4;
          local_1c8[uVar33] =
               (uVar4 / uVar5) * (ulong)((int)uVar5 - (int)uVar6 & uVar31) |
               (long)(int)~uVar9 + uVar6 & uVar27 |
               (ulong)(uVar9 - (int)uVar5 & uVar31) / (uVar5 / uVar6);
        }
        if (uVar34 < 0x2d) {
          puVar20 = blockmap_PSMCT32;
          if ((0x101008080003U >> uVar22 & 1) == 0) {
            if ((0x100004UL >> uVar22 & 1) == 0) {
              if (uVar22 != 10) goto LAB_00129d03;
              puVar20 = blockmap_PSMCT16S;
            }
            else {
              puVar20 = blockmap_PSMCT16;
            }
          }
          local_1c8[uVar33] =
               (ulong)(byte)puVar20[(uint)local_1c8[uVar33] & 0x1f] |
               local_1c8[uVar33] & 0xffffffffffffffe0;
        }
LAB_00129d03:
        uVar33 = uVar33 + 1;
      } while (uVar17 != uVar33);
      if (1 < uVar39) {
        uVar33 = (uint)(iVar8 << 0xb) / local_260;
        uVar27 = uVar23 / uVar37;
        iVar42 = (int)(local_260 / uVar37);
        uVar39 = (uint)uVar33;
        uVar30 = (uint)((ulong)(uVar39 - (int)uVar27 & uVar30) / (uVar27 / (local_260 / uVar37))) |
                 (int)(uVar33 / uVar27) * ((int)uVar27 - iVar42 & uVar30) |
                 ~uVar39 + iVar42 & uVar30;
      }
      if (uVar34 < 0x2d) {
        if ((0x101008080003U >> uVar22 & 1) == 0) {
          if ((0x100004UL >> uVar22 & 1) == 0) {
            if (uVar22 != 10) goto LAB_00129e09;
            puVar20 = blockmap_PSMCT16S;
          }
          else {
            puVar20 = blockmap_PSMCT16;
          }
        }
        else {
          puVar20 = blockmap_PSMCT32;
        }
        uVar30 = (uint)(byte)puVar20[uVar30 & 0x1f] | uVar30 & 0xffffffe0;
      }
LAB_00129e09:
      iVar42 = ((int)(((uVar47 / uVar37) * local_178 * uVar36) / uVar32) + local_168[lVar46]) * 0x40
      ;
      iVar8 = local_210 * local_244 * iVar14;
      *(int *)(&raster->field_0x24 + lVar26) = iVar8;
      *(ulong *)((long)&raster->format + lVar26) =
           (local_1c8[3] & 0x3fff) << 0x28 |
           auStack_150[4] << 0x36 | (local_1c8[2] & 0x3fff) << 0x14 |
           auStack_150[3] << 0x22 | local_1c8[1] & 0x3fff | auStack_150[2] << 0xe;
      *(ulong *)((long)&raster->height + lVar26) =
           (local_1c8[6] & 0x3fff) << 0x28 |
           auStack_150[7] << 0x36 | (local_1c8[5] & 0x3fff) << 0x14 |
           auStack_150[6] << 0x22 | local_1c8[4] & 0x3fff | auStack_150[5] << 0xe;
      *(char *)((long)&raster->privateFlags + lVar26 + 2) = (char)local_108;
      *(int *)((long)&raster->pixels + lVar26) = iVar42;
      if (iVar8 == 0) goto LAB_00129f4d;
      *(uint *)((long)&raster->flags + lVar26) = uVar30;
      if (uVar30 << 6 == iVar42) {
        *(int *)((long)&raster->pixels + lVar26) = iVar42 + 0x800;
      }
    }
    else {
      *(uint *)((long)&raster->stride + lVar26) = (iVar25 >> 3) * uVar39 + 0xf & 0xfffffff0;
      iVar35 = local_210 * local_244 * iVar14;
      *(int *)(&raster->field_0x24 + lVar26) = iVar35;
      *(undefined8 *)((long)&raster->format + lVar26) = 0x40000400004000;
      *(undefined8 *)((long)&raster->height + lVar26) = 0x40000400004000;
      *(undefined1 *)((long)&raster->privateFlags + lVar26 + 2) = 0;
      iVar25 = (int)(uVar30 + uVar31 + -1) / (int)uVar31;
      iVar8 = (int)(uVar39 + iVar11 + -1) / iVar11;
      local_1c8[0] = 0;
      local_98[0] = 0;
      iVar24 = uVar31 * iVar25;
      iVar42 = iVar24 + 0x3f;
      if (-1 < iVar24) {
        iVar42 = iVar24;
      }
      auStack_150[1] = (long)(iVar42 >> 6);
      iVar25 = iVar25 * iVar8;
      uVar17 = iVar25 * 0x800;
      *(uint *)((long)&raster->pixels + lVar26) = uVar17;
      if (iVar35 == 0) {
LAB_00129f4d:
        *(undefined4 *)((long)&raster->flags + lVar26) = 0;
      }
      else if (((int)uVar30 < iVar24) || ((int)uVar39 < iVar8 * iVar11)) {
        *(uint *)((long)&raster->flags + lVar26) = uVar17 - 0x100 >> 6;
      }
      else {
        *(uint *)((long)&raster->flags + lVar26) = uVar17 >> 6;
        *(int *)((long)&raster->pixels + lVar26) =
             (((iVar14 + iVar12 + -1) / iVar12) * ((local_210 + iVar18 + -1) / iVar18) + iVar25) *
             0x800;
      }
    }
    *(ulong *)((long)&raster->platform + lVar26) =
         local_1d0 | local_218 | local_1e8 << 0x33 | uVar41 | uVar43 | local_100 << 0xe |
         (ulong)(uVar34 << 0x14);
    uVar30 = *(int *)((long)&raster->stride + lVar26) + 0xfU & 0xfffffff0;
    *(uint *)((long)&raster->stride + lVar26) = uVar30;
    if (noNewStyleRasters == 0) {
      uVar39 = raster->width;
      uVar17 = raster->height;
      iVar42 = raster->depth;
      if (0x3fff7f < (int)(uVar17 * uVar39 * iVar42)) goto LAB_00129fca;
      uVar30 = (uint)(*(byte *)((long)&raster->privateFlags + lVar26 + 2) >> 2);
      bVar44 = *(byte *)((long)&raster->pixels + lVar26 + 4);
      *(byte *)((long)&raster->pixels + lVar26 + 4) = bVar44 | 1;
      if (uVar34 == 0x13) {
        uVar31 = local_98[uVar30];
        *(byte *)((long)&raster->pixels + lVar26 + 4) = bVar44 | 3;
        if ((((char)local_188 == '\0') || (auStack_150[(ulong)uVar30 + 1] != 2)) ||
           (uVar23 = *(uint *)((long)&raster->flags + lVar26),
           uVar31 = (((uVar31 >> 4 & 0x7f) + (uVar31 >> 0x11 & 0x3f8)) -
                    ((uint)(byte)blockmaprev_PSMCT32[(uint)local_1c8[uVar30] & 0x1f] |
                    (uint)local_1c8[uVar30] & 0xffffffe0)) +
                    ((uint)(byte)blockmaprev_PSMCT32[uVar23 & 0x1f] | uVar23 & 0xffffffe0),
           0x7ff < uVar31)) goto LAB_0012a107;
        local_260 = (ulong)((uVar31 & 0x7f8) * 0x10000 + (uVar31 & 7) * 8);
      }
      else {
LAB_0012a107:
        local_260 = 0;
      }
      uVar30 = uVar30 + 1;
      if ((uVar34 == 0x14) && (0x31000 < version)) {
        pbVar2 = (byte *)((long)&raster->pixels + lVar26 + 4);
        *pbVar2 = *pbVar2 | 4;
      }
      iVar8 = uVar30 * 0x50;
      *(int *)((long)&raster->stride + lVar26) = iVar8;
      uVar31 = 2;
      if (uVar34 < 0x3b) {
        if ((0x2101008180002U >> uVar22 & 1) == 0) {
          if ((0x404000000000404U >> uVar22 & 1) != 0) {
            uVar31 = 4;
          }
        }
        else {
          uVar31 = 8;
        }
      }
      uVar49 = (uint)*(byte *)((long)&raster->pixels + lVar26 + 4);
      bVar44 = (byte)((uVar49 & 2) >> 1) & uVar22 == 0x13;
      uVar23 = 0x10;
      if (bVar44 == 0) {
        uVar23 = uVar31;
      }
      bVar38 = (byte)((uVar49 & 4) >> 2) & uVar22 == 0x14;
      uVar31 = 0x20;
      if (bVar38 == 0) {
        uVar31 = uVar23;
      }
      uVar49 = (uint)(bVar38 | bVar44) * 3 + 1;
      uVar23 = uVar30;
      do {
        uVar45 = uVar31;
        if ((int)uVar31 < (int)uVar39) {
          uVar45 = uVar39;
        }
        uVar9 = uVar49;
        if ((int)uVar49 < (int)uVar17) {
          uVar9 = uVar17;
        }
        iVar12 = uVar9 * iVar42 * uVar45;
        iVar11 = iVar12 + 7;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar8 = iVar8 + ((iVar11 >> 3) + 0xfU & 0xfffffff0);
        uVar39 = (int)uVar39 / 2;
        uVar17 = (int)uVar17 / 2;
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
      *(int *)((long)&raster->stride + lVar26) = iVar8;
      if (*(int *)(&raster->field_0x24 + lVar26) != 0) {
        iVar42 = 3;
        if (version < 0x31001) {
          iVar42 = iVar14;
        }
        if (iVar14 != 2) {
          iVar42 = iVar14;
        }
        iVar14 = iVar42;
        *(int *)(&raster->field_0x24 + lVar26) = local_244 * local_210 * iVar14 + 0x50;
      }
      uVar41 = 0;
      iVar42 = 0;
      uVar47 = 0x10;
      do {
        uVar43 = (ulong)((int)uVar47 + 0x40);
        if (local_98[uVar41] != 0) {
          uVar43 = uVar47;
        }
        iVar42 = iVar42 + (uint)(local_98[uVar41] == 0);
        uVar41 = uVar41 + 1;
        uVar47 = uVar43;
      } while (uVar30 != uVar41);
      iVar11 = *(int *)(&raster->field_0x24 + lVar26);
      uVar47 = (ulong)((int)uVar43 + 0x40);
      if ((iVar11 == 0) || (uVar43 = uVar47, local_260 != 0)) {
        uVar47 = uVar43;
        uVar39 = iVar11 + iVar8 + 0x3fU & 0xffffffc0;
      }
      else {
        uVar39 = (iVar11 + 0x3fU & 0xffffffc0) + (iVar8 + 0x7fU & 0xffffff80);
      }
      iVar42 = iVar42 + (uint)(iVar11 != 0);
      uVar39 = (int)uVar47 + uVar39 + 0x70;
      *(uint *)((long)&raster->originalPixels + lVar26) = uVar39;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2raster.cpp line: 89"
      ;
      lVar46 = (*Engine::memfuncs)((ulong)uVar39 + 0x48);
      if (lVar46 == 0) {
        puVar15 = (uint8 *)0x0;
      }
      else {
        puVar15 = (uint8 *)(lVar46 + 0x48U & 0xffffffffffffffc0);
        *(long *)(puVar15 + -8) = lVar46;
      }
      *(uint8 **)((long)&raster->palette + lVar26) = puVar15;
      *(int *)(puVar15 + 8) = iVar42;
      *(int *)(puVar15 + 0xc) = iVar42;
      puVar21 = (undefined8 *)((ulong)(puVar15 + uVar47 + 0x7f) & 0xffffffffffffff80);
      *(undefined8 **)puVar15 = puVar21;
      raster->pixels = puVar15;
      if (*(int *)(&raster->field_0x24 + lVar26) != 0) {
        raster->palette =
             (uint8 *)((long)puVar21 +
                      (ulong)(*(int *)((long)&raster->stride + lVar26) + 0x7fU & 0xffffff80) + 0x50)
        ;
      }
      puVar10 = puVar15 + 0x10;
      uVar39 = raster->width;
      uVar17 = raster->height;
      uVar23 = (uint)*(byte *)((long)&raster->pixels + lVar26 + 4);
      bVar38 = (byte)((uVar23 & 2) >> 1) & uVar22 == 0x13;
      bVar44 = (byte)((uVar23 & 4) >> 2) & uVar22 == 0x14;
      uVar47 = 0;
      do {
        uVar23 = uVar31;
        if ((int)uVar31 < (int)uVar39) {
          uVar23 = uVar39;
        }
        uVar45 = uVar49;
        if ((int)uVar49 < (int)uVar17) {
          uVar45 = uVar17;
        }
        *puVar21 = 0x1000000000000003;
        puVar21[1] = 0xe;
        *(undefined4 *)(puVar21 + 2) = 0;
        uVar9 = local_98[uVar47] >> 1 & 0x7fff7fff;
        if (bVar38 == 0 && bVar44 == 0) {
          uVar9 = local_98[uVar47];
        }
        *(uint *)((long)puVar21 + 0x14) = uVar9;
        puVar21[3] = 0x51;
        if (bVar38 == 0 && bVar44 == 0) {
          *(uint *)(puVar21 + 4) = uVar23;
          *(uint *)((long)puVar21 + 0x24) = uVar45;
        }
        else {
          *(uint *)(puVar21 + 4) = uVar23 >> 1;
          *(uint *)((long)puVar21 + 0x24) = uVar45 >> 1;
        }
        puVar21[5] = 0x52;
        puVar21[6] = 0;
        puVar21[7] = 0x53;
        iVar8 = uVar23 * uVar45 * raster->depth;
        iVar42 = iVar8 + 7;
        if (-1 < iVar8) {
          iVar42 = iVar8;
        }
        uVar23 = (iVar42 >> 3) + 0xf >> 4;
        *(uint *)(puVar21 + 8) = uVar23 & 0x7fff;
        *(undefined8 *)((long)puVar21 + 0x44) = 0x8000000;
        *(undefined4 *)((long)puVar21 + 0x4c) = 0;
        if (local_98[uVar47] == 0) {
          puVar10[0] = '\x02';
          puVar10[1] = '\0';
          puVar10[2] = '\0';
          puVar10[3] = '\x10';
          puVar10[4] = '\0';
          puVar10[5] = '\0';
          puVar10[6] = '\0';
          puVar10[7] = '\0';
          puVar10[8] = '\0';
          puVar10[9] = '\0';
          puVar10[10] = '\0';
          puVar10[0xb] = '\0';
          puVar10[0xc] = '\x02';
          puVar10[0xd] = '\0';
          puVar10[0xe] = '\0';
          puVar10[0xf] = 'P';
          puVar10[0x10] = '\x01';
          puVar10[0x11] = '\0';
          puVar10[0x12] = '\0';
          puVar10[0x13] = '\0';
          puVar10[0x14] = '\0';
          puVar10[0x15] = '\0';
          puVar10[0x16] = '\0';
          puVar10[0x17] = '\x10';
          puVar10[0x18] = '\x0e';
          puVar10[0x19] = '\0';
          puVar10[0x1a] = '\0';
          puVar10[0x1b] = '\0';
          puVar10[0x1c] = '\0';
          puVar10[0x1d] = '\0';
          puVar10[0x1e] = '\0';
          puVar10[0x1f] = '\0';
          uVar45 = (uint)auStack_150[uVar47 + 1];
          if (bVar38 == 0) {
            if (bVar44 != 0) {
              uVar45 = (uVar45 & 0x1fbfe) << 0xf | 0x2000000;
              goto LAB_0012a4e6;
            }
            *(uint *)(puVar10 + 0x20) = uVar45 << 0x10 | uVar34 << 0x18;
            *(uint *)(puVar10 + 0x24) = (uint)local_1c8[uVar47] | uVar34 << 0x18 | uVar45 << 0x10;
          }
          else {
            uVar45 = (uVar45 & 0xfffffffe) << 0xf;
LAB_0012a4e6:
            *(uint *)(puVar10 + 0x20) = uVar45;
            *(uint *)(puVar10 + 0x24) = uVar45 | (uint)local_1c8[uVar47];
          }
          puVar10[0x28] = 'P';
          puVar10[0x29] = '\0';
          puVar10[0x2a] = '\0';
          puVar10[0x2b] = '\0';
          puVar10[0x2c] = '\0';
          puVar10[0x2d] = '\0';
          puVar10[0x2e] = '\0';
          puVar10[0x2f] = '\0';
          *(uint *)(puVar10 + 0x30) = uVar23 + 5 | 0x30000000;
          *(int *)(puVar10 + 0x34) = (int)puVar21;
          puVar10[0x38] = '\0';
          puVar10[0x39] = '\0';
          puVar10[0x3a] = '\0';
          puVar10[0x3b] = '\0';
          *(uint *)(puVar10 + 0x3c) = uVar23 + 5 | 0x50000000;
          puVar10 = puVar10 + 0x40;
        }
        else {
          *(uint *)(puVar10 + -0x10) = *(ushort *)(puVar10 + -0x10) + uVar23 + 5 | 0x30000000;
          *(uint *)(puVar10 + -4) = *(ushort *)(puVar10 + -4) + uVar23 + 5 | 0x50000000;
        }
        puVar21 = (undefined8 *)((long)puVar21 + (ulong)(uVar23 << 2) * 4 + 0x50);
        uVar39 = (int)uVar39 / 2;
        uVar17 = (int)uVar17 / 2;
        uVar47 = uVar47 + 1;
      } while (uVar30 != uVar47);
      if (*(int *)(&raster->field_0x24 + lVar26) != 0) {
        if (local_260 != 0) {
          raster->palette = (uint8 *)(puVar21 + 10);
        }
        puVar3 = raster->palette;
        puVar3[-0x50] = '\x03';
        puVar3[-0x4f] = '\0';
        puVar3[-0x4e] = '\0';
        puVar3[-0x4d] = '\0';
        puVar3[-0x4c] = '\0';
        puVar3[-0x4b] = '\0';
        puVar3[-0x4a] = '\0';
        puVar3[-0x49] = '\x10';
        puVar3[-0x48] = '\x0e';
        puVar3[-0x47] = '\0';
        puVar3[-0x46] = '\0';
        puVar3[-0x45] = '\0';
        puVar3[-0x44] = '\0';
        puVar3[-0x43] = '\0';
        puVar3[-0x42] = '\0';
        puVar3[-0x41] = '\0';
        *(ulong *)(puVar3 + -0x40) = local_260;
        puVar3[-0x38] = 'Q';
        puVar3[-0x37] = '\0';
        puVar3[-0x36] = '\0';
        puVar3[-0x35] = '\0';
        puVar3[-0x34] = '\0';
        puVar3[-0x33] = '\0';
        puVar3[-0x32] = '\0';
        puVar3[-0x31] = '\0';
        *(int *)(puVar3 + -0x30) = local_210;
        *(int *)(puVar3 + -0x2c) = iVar14;
        puVar3[-0x28] = 'R';
        puVar3[-0x27] = '\0';
        puVar3[-0x26] = '\0';
        puVar3[-0x25] = '\0';
        puVar3[-0x24] = '\0';
        puVar3[-0x23] = '\0';
        puVar3[-0x22] = '\0';
        puVar3[-0x21] = '\0';
        puVar3[-0x20] = '\0';
        puVar3[-0x1f] = '\0';
        puVar3[-0x1e] = '\0';
        puVar3[-0x1d] = '\0';
        puVar3[-0x1c] = '\0';
        puVar3[-0x1b] = '\0';
        puVar3[-0x1a] = '\0';
        puVar3[-0x19] = '\0';
        puVar3[-0x18] = 'S';
        puVar3[-0x17] = '\0';
        puVar3[-0x16] = '\0';
        puVar3[-0x15] = '\0';
        puVar3[-0x14] = '\0';
        puVar3[-0x13] = '\0';
        puVar3[-0x12] = '\0';
        puVar3[-0x11] = '\0';
        uVar30 = *(int *)(&raster->field_0x24 + lVar26) - 0x41U >> 4;
        *(uint *)(puVar3 + -0x10) = uVar30 & 0x7fff;
        puVar3[-0xc] = '\0';
        puVar3[-0xb] = '\0';
        puVar3[-10] = '\0';
        puVar3[-9] = '\b';
        puVar3[-8] = '\0';
        puVar3[-7] = '\0';
        puVar3[-6] = '\0';
        puVar3[-5] = '\0';
        puVar3[-4] = '\0';
        puVar3[-3] = '\0';
        puVar3[-2] = '\0';
        puVar3[-1] = '\0';
        puVar10[0] = '\x02';
        puVar10[1] = '\0';
        puVar10[2] = '\0';
        puVar10[3] = '\x10';
        puVar10[4] = '\0';
        puVar10[5] = '\0';
        puVar10[6] = '\0';
        puVar10[7] = '\0';
        puVar10[8] = '\0';
        puVar10[9] = '\0';
        puVar10[10] = '\0';
        puVar10[0xb] = '\0';
        puVar10[0xc] = '\x02';
        puVar10[0xd] = '\0';
        puVar10[0xe] = '\0';
        puVar10[0xf] = 'P';
        puVar10[0x10] = '\x01';
        puVar10[0x11] = '\0';
        puVar10[0x12] = '\0';
        puVar10[0x13] = '\0';
        puVar10[0x14] = '\0';
        puVar10[0x15] = '\0';
        puVar10[0x16] = '\0';
        puVar10[0x17] = '\x10';
        puVar10[0x18] = '\x0e';
        puVar10[0x19] = '\0';
        puVar10[0x1a] = '\0';
        puVar10[0x1b] = '\0';
        puVar10[0x1c] = '\0';
        puVar10[0x1d] = '\0';
        puVar10[0x1e] = '\0';
        puVar10[0x1f] = '\0';
        if (local_260 == 0) {
          uVar39 = (int)local_1e8 << 0x18 | 0x10000;
          *(uint *)(puVar10 + 0x20) = uVar39;
          *(uint *)(puVar10 + 0x24) = uVar39 | *(uint *)((long)&raster->flags + lVar26);
          puVar10[0x28] = 'P';
          puVar10[0x29] = '\0';
          puVar10[0x2a] = '\0';
          puVar10[0x2b] = '\0';
          puVar10[0x2c] = '\0';
          puVar10[0x2d] = '\0';
          puVar10[0x2e] = '\0';
          puVar10[0x2f] = '\0';
        }
        else {
          *(uint *)(puVar10 + 0x20) = *(uint *)(puVar10 + -0x20);
          *(undefined8 *)(puVar10 + 0x24) = *(undefined8 *)(puVar10 + -0x1c);
          *(uint *)(puVar10 + 0x2c) = *(uint *)(puVar10 + -0x14);
          *(uint *)(puVar10 + -0x20) =
               (*(uint *)(puVar10 + -0x20) & 0xffff) + uVar30 + 5 | 0x30000000;
          *(uint *)(puVar10 + -0x14) =
               (*(uint *)(puVar10 + -0x14) & 0xffff) + uVar30 + 5 | 0x50000000;
          *(int *)(puVar15 + 8) = *(int *)(puVar15 + 8) + -1;
        }
        *(uint *)(puVar10 + 0x30) = uVar30 + 5 | 0x30000000;
        *(int *)(puVar10 + 0x34) = (int)puVar3 + -0x50;
        puVar10[0x38] = '\0';
        puVar10[0x39] = '\0';
        puVar10[0x3a] = '\0';
        puVar10[0x3b] = '\0';
        *(uint *)(puVar10 + 0x3c) = uVar30 + 5 | 0x50000000;
      }
    }
    else {
LAB_00129fca:
      uVar30 = uVar30 + *(int *)(&raster->field_0x24 + lVar26);
      *(uint *)((long)&raster->originalPixels + lVar26) = uVar30;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2raster.cpp line: 89"
      ;
      lVar46 = (*Engine::memfuncs)((ulong)uVar30 + 0x48,0x30a04);
      if (lVar46 == 0) {
        puVar15 = (uint8 *)0x0;
      }
      else {
        puVar15 = (uint8 *)(lVar46 + 0x48U & 0xffffffffffffffc0);
        *(long *)(puVar15 + -8) = lVar46;
      }
      *(uint8 **)((long)&raster->palette + lVar26) = puVar15;
      raster->pixels = puVar15;
      if (*(int *)(&raster->field_0x24 + lVar26) != 0) {
        raster->palette = puVar15 + *(uint *)((long)&raster->stride + lVar26);
      }
      if (raster->depth == 8) {
        pbVar2 = (byte *)((long)&raster->pixels + lVar26 + 4);
        *pbVar2 = *pbVar2 | 2;
      }
    }
    raster->originalPixels = raster->pixels;
    raster->originalStride = raster->stride;
    pRVar16 = raster;
    if ((*(byte *)((long)&raster->pixels + lVar26 + 4) & 1) != 0) {
      *local_b0 = (uint8 *)(*(long *)raster->pixels + 0x50);
    }
    break;
  case 1:
  case 2:
    raster->flags = 0x80;
    pRVar16 = raster;
  }
switchD_00128d7c_caseD_3:
  return pRVar16;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	if(!getRasterFormat(raster))
		return nil;

	// init raster
	raster->pixels = nil;
	raster->palette = nil;
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalPixels = raster->pixels;
	if(raster->width == 0 || raster->height == 0){
		raster->flags = Raster::DONTALLOCATE;
		raster->stride = 0;
		raster->originalStride = 0;
		return raster;
	}

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		return rasterCreateTexture(raster);
	case Raster::ZBUFFER:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERA:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERATEXTURE:
		// TODO. only RW_PS2
		// check width/height and fall through to texture
		return nil;
	}
	return nil;
}